

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  short sVar1;
  int iVar2;
  Arena *pAVar3;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_00;
  int iVar4;
  Extension *pEVar5;
  MessageLite *pMVar6;
  string *psVar7;
  string *extraout_RAX;
  MessageLite *extraout_RAX_00;
  MessageLite *pMVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  Arena *arena;
  ExtensionSet *const_this;
  int iStack_44;
  code *pcStack_40;
  undefined1 auStack_38 [16];
  
  puVar9 = auStack_38;
  puVar10 = auStack_38;
  pcStack_40 = (code *)0x25cfdc;
  pEVar5 = FindOrNull(this,number);
  if (pEVar5 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar5->is_repeated == false) {
    psVar7 = (string *)0x0;
  }
  else {
    pcStack_40 = (code *)0x25d0ad;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 != (string *)0x0) {
    pcStack_40 = (code *)0x25d0db;
    ReleaseMessage();
    psVar7 = extraout_RAX;
    goto LAB_0025d0db;
  }
  if ((byte)(pEVar5->type - 0x13) < 0xee) {
    pcStack_40 = (code *)0x25d0ba;
    ReleaseMessage((ExtensionSet *)auStack_38);
LAB_0025d0ba:
    pcStack_40 = (code *)0x25d0cb;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)puVar9,10,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
  }
  else {
    puVar9 = (undefined1 *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar5->type * 4);
    if (puVar9 != (undefined1 *)0xa) goto LAB_0025d0ba;
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    pAVar3 = this->arena_;
    if ((pEVar5->field_0xa & 4) == 0) {
      pMVar6 = (MessageLite *)(pEVar5->field_0).int64_t_value;
      if (pAVar3 != (Arena *)0x0) {
        pcStack_40 = (code *)0x25d045;
        pMVar6 = MessageLite::New(pMVar6,(Arena *)0x0);
        pcStack_40 = (code *)0x25d053;
        MessageLite::CheckTypeAndMergeFrom(pMVar6,(MessageLite *)pEVar5->field_0);
      }
    }
    else {
      pcStack_40 = (code *)0x25d069;
      pMVar6 = (MessageLite *)
               (**(code **)(**(long **)&(pEVar5->field_0).int32_t_value + 0x40))
                         (*(long **)&(pEVar5->field_0).int32_t_value,prototype,pAVar3);
      if ((pAVar3 == (Arena *)0x0) && ((long *)(pEVar5->field_0).int64_t_value != (long *)0x0)) {
        pcStack_40 = (code *)0x25d07f;
        (**(code **)(*(long *)(pEVar5->field_0).int64_t_value + 8))();
      }
    }
    pcStack_40 = (code *)0x25d089;
    Erase(this,number);
    return pMVar6;
  }
LAB_0025d0db:
  iVar4 = (int)psVar7;
  pcStack_40 = Erase;
  ReleaseMessage();
  sVar1 = *(short *)(puVar10 + 10);
  this_00 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)(puVar10 + 0x10);
  iStack_44 = iVar4;
  pcStack_40 = (code *)(ulong)(uint)number;
  if ((long)sVar1 < 0) {
    pMVar6 = (MessageLite *)
             absl::lts_20240722::container_internal::
             btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
             ::erase<int>(this_00,&iStack_44);
  }
  else {
    pMVar6 = extraout_RAX_00;
    if (sVar1 != 0) {
      pMVar8 = (MessageLite *)((long)sVar1 * 0x20);
      pMVar6 = (MessageLite *)0x0;
      do {
        iVar2 = *(int *)((long)&pMVar6->_vptr_MessageLite + (long)&this_00->tree_);
        if (iVar2 != iVar4 && iVar4 <= iVar2) {
          return pMVar6;
        }
        if (iVar2 == iVar4) {
          if (pMVar8 + -2 != pMVar6) {
            pMVar6 = (MessageLite *)
                     memmove((void *)((long)&pMVar6->_vptr_MessageLite + (long)&this_00->tree_),
                             (void *)((long)&pMVar6[2]._vptr_MessageLite + (long)&this_00->tree_),
                             (long)pMVar8 + (-0x20 - (long)pMVar6));
          }
          *(short *)(puVar10 + 10) = *(short *)(puVar10 + 10) + -1;
          return pMVar6;
        }
        pMVar6 = pMVar6 + 2;
      } while (pMVar8 != pMVar6);
    }
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}